

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_loshelf2_config *
ma_loshelf2_config_init
          (ma_format format,ma_uint32 channels,ma_uint32 sampleRate,double gainDB,double shelfSlope,
          double frequency)

{
  ma_uint32 in_ECX;
  ma_uint32 in_EDX;
  ma_format in_ESI;
  ma_loshelf2_config *in_RDI;
  double in_XMM0_Qa;
  double in_XMM1_Qa;
  double in_XMM2_Qa;
  
  if (in_RDI != (ma_loshelf2_config *)0x0) {
    memset(in_RDI,0,0x28);
  }
  in_RDI->format = in_ESI;
  in_RDI->channels = in_EDX;
  in_RDI->sampleRate = in_ECX;
  in_RDI->gainDB = in_XMM0_Qa;
  in_RDI->shelfSlope = in_XMM1_Qa;
  in_RDI->frequency = in_XMM2_Qa;
  return in_RDI;
}

Assistant:

MA_API ma_loshelf2_config ma_loshelf2_config_init(ma_format format, ma_uint32 channels, ma_uint32 sampleRate, double gainDB, double shelfSlope, double frequency)
{
    ma_loshelf2_config config;

    MA_ZERO_OBJECT(&config);
    config.format     = format;
    config.channels   = channels;
    config.sampleRate = sampleRate;
    config.gainDB     = gainDB;
    config.shelfSlope = shelfSlope;
    config.frequency  = frequency;

    return config;
}